

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.h
# Opt level: O2

void __thiscall StatusPrinter::~StatusPrinter(StatusPrinter *this)

{
  ~StatusPrinter(this);
  operator_delete(this,0xe8);
  return;
}

Assistant:

virtual ~StatusPrinter() { }